

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_kotlin.cpp
# Opt level: O0

string * flatbuffers::kotlin::KotlinGenerator::Indirect
                   (string *__return_storage_ptr__,string *index,bool fixed)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  undefined1 local_19;
  string *psStack_18;
  bool fixed_local;
  string *index_local;
  
  local_19 = fixed;
  psStack_18 = index;
  index_local = __return_storage_ptr__;
  if (fixed) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)index);
  }
  else {
    std::operator+(&local_40,"__indirect(",index);
    std::operator+(__return_storage_ptr__,&local_40,")");
    std::__cxx11::string::~string((string *)&local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string Indirect(const std::string &index, bool fixed) {
    // We apply __indirect() and struct is not fixed.
    if (!fixed) return "__indirect(" + index + ")";
    return index;
  }